

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cse_optimizer.cpp
# Opt level: O2

void __thiscall
duckdb::CommonSubExpressionOptimizer::CountExpressions
          (CommonSubExpressionOptimizer *this,Expression *expr,CSEReplacementState *state)

{
  ExpressionClass EVar1;
  bool bVar2;
  int iVar3;
  iterator iVar4;
  mapped_type *pmVar5;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  EVar1 = (expr->super_BaseExpression).expression_class;
  local_48._8_8_ = state;
  if (EVar1 != BOUND_AGGREGATE) {
    if (EVar1 == BOUND_COLUMN_REF) {
      return;
    }
    if (EVar1 == BOUND_CONSTANT) {
      return;
    }
    if (EVar1 == BOUND_PARAMETER) {
      return;
    }
    iVar3 = (*(expr->super_BaseExpression)._vptr_BaseExpression[0xc])(expr);
    if ((char)iVar3 == '\0') {
      local_48._M_unused._M_object = expr;
      iVar4 = ::std::
              _Hashtable<std::reference_wrapper<duckdb::Expression>,_std::pair<const_std::reference_wrapper<duckdb::Expression>,_duckdb::CSENode>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_duckdb::CSENode>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(state->expression_count)._M_h,(key_type *)&local_48);
      if (iVar4.
          super__Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::Expression>,_duckdb::CSENode>,_true>
          ._M_cur == (__node_type *)0x0) {
        if (state->short_circuited == false) {
          local_48._M_unused._M_object = expr;
          pmVar5 = ::std::__detail::
                   _Map_base<std::reference_wrapper<duckdb::Expression>,_std::pair<const_std::reference_wrapper<duckdb::Expression>,_duckdb::CSENode>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_duckdb::CSENode>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::reference_wrapper<duckdb::Expression>,_std::pair<const_std::reference_wrapper<duckdb::Expression>,_duckdb::CSENode>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_duckdb::CSENode>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&state->expression_count,(key_type *)&local_48);
          pmVar5->count = 1;
          (pmVar5->column_index).index = 0xffffffffffffffff;
        }
      }
      else {
        *(long *)((long)iVar4.
                        super__Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::Expression>,_duckdb::CSENode>,_true>
                        ._M_cur + 0x10) =
             *(long *)((long)iVar4.
                             super__Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::Expression>,_duckdb::CSENode>,_true>
                             ._M_cur + 0x10) + 1;
      }
    }
    if (((expr->super_BaseExpression).expression_class | COLUMN_REF) == BOUND_CONJUNCTION) {
      bVar2 = state->short_circuited;
      local_30 = ::std::
                 _Function_handler<void_(duckdb::Expression_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/cse_optimizer.cpp:81:47)>
                 ::_M_invoke;
      local_38 = ::std::
                 _Function_handler<void_(duckdb::Expression_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/cse_optimizer.cpp:81:47)>
                 ::_M_manager;
      local_48._M_unused._M_object = this;
      ExpressionIterator::EnumerateChildren(expr,(function<void_(duckdb::Expression_&)> *)&local_48)
      ;
      ::std::_Function_base::~_Function_base((_Function_base *)&local_48);
      state->short_circuited = bVar2;
      return;
    }
  }
  local_30 = ::std::
             _Function_handler<void_(duckdb::Expression_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/cse_optimizer.cpp:90:47)>
             ::_M_invoke;
  local_38 = ::std::
             _Function_handler<void_(duckdb::Expression_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/cse_optimizer.cpp:90:47)>
             ::_M_manager;
  local_48._M_unused._M_object = this;
  ExpressionIterator::EnumerateChildren(expr,(function<void_(duckdb::Expression_&)> *)&local_48);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_48);
  return;
}

Assistant:

void CommonSubExpressionOptimizer::CountExpressions(Expression &expr, CSEReplacementState &state) {
	// we only consider expressions with children for CSE elimination
	switch (expr.GetExpressionClass()) {
	case ExpressionClass::BOUND_COLUMN_REF:
	case ExpressionClass::BOUND_CONSTANT:
	case ExpressionClass::BOUND_PARAMETER:
		return;
	default:
		break;
	}
	if (expr.GetExpressionClass() != ExpressionClass::BOUND_AGGREGATE && !expr.IsVolatile()) {
		// we can't move aggregates to a projection, so we only consider the children of the aggregate
		auto node = state.expression_count.find(expr);
		if (node == state.expression_count.end()) {
			// first time we encounter this expression, insert this node with [count = 1]
			// but only if it is not an interior argument of a short circuit sensitive expression.
			if (!state.short_circuited) {
				state.expression_count[expr] = CSENode();
			}
		} else {
			// we encountered this expression before, increment the occurrence count
			node->second.count++;
		}
	}

	// If we have a function that uses short circuiting, then we can only extract CSEs from the leftmost
	// side of the argument tree (child_no == 0)
	switch (expr.GetExpressionClass()) {
	case ExpressionClass::BOUND_CONJUNCTION:
	case ExpressionClass::BOUND_CASE: {
		// Save the short circuit reference
		const auto save_short_circuit = state.short_circuited;
		ExpressionIterator::EnumerateChildren(expr, [&](Expression &child) {
			CountExpressions(child, state);
			state.short_circuited = true;
		});
		state.short_circuited = save_short_circuit;
		break;
	}
	default:
		// recursively count the children
		ExpressionIterator::EnumerateChildren(expr, [&](Expression &child) { CountExpressions(child, state); });
		break;
	}
}